

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_queue.c
# Opt level: O1

ItemQueue * ItemQueue_new_array(int size)

{
  ItemQueue *pIVar1;
  
  pIVar1 = (ItemQueue *)malloc((long)size << 4);
  if (0 < size) {
    pIVar1 = (ItemQueue *)memset(pIVar1,0,(ulong)(uint)size << 4);
    return pIVar1;
  }
  return pIVar1;
}

Assistant:

ItemQueue* ItemQueue_new_array(int size) {
    ItemQueue* item_queues = (ItemQueue*)malloc(size * sizeof(ItemQueue));
    int i;
    for (i = 0; i < size; ++i) {
        item_queues[i].first = 0;
        item_queues[i].last = 0;
    }
    return item_queues;
}